

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ted_algorithm_touzet.h
# Opt level: O0

void __thiscall
ted::TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
init_matrices(TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              *this,int t1_size,int k)

{
  double dVar1;
  BandMatrix<double> local_78;
  BandMatrix<double> local_48;
  int local_18;
  int local_14;
  int k_local;
  int t1_size_local;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *this_local;
  
  local_18 = k;
  local_14 = t1_size;
  _k_local = this;
  data_structures::BandMatrix<double>::BandMatrix(&local_48,(long)t1_size,(long)k);
  data_structures::BandMatrix<double>::operator=(&this->td_,&local_48);
  data_structures::BandMatrix<double>::~BandMatrix(&local_48);
  dVar1 = std::numeric_limits<double>::infinity();
  data_structures::Matrix<double>::fill_with(&(this->td_).super_Matrix<double>,dVar1);
  data_structures::BandMatrix<double>::BandMatrix
            (&local_78,(long)(local_14 + 1),(long)(local_18 + 1));
  data_structures::BandMatrix<double>::operator=(&this->fd_,&local_78);
  data_structures::BandMatrix<double>::~BandMatrix(&local_78);
  dVar1 = std::numeric_limits<double>::infinity();
  data_structures::Matrix<double>::fill_with(&(this->fd_).super_Matrix<double>,dVar1);
  return;
}

Assistant:

void init_matrices(int t1_size, int k) {
    using data_structures::BandMatrix;
    // NOTE: The default constructor of Matrix is called while constructing
    //       the algorithm object.
    // QUESTION: Shouldn't we implement Matrix::resize() instead of constructing
    //           matrix again?
    // NOTE: The k may be larger than |T2| that uses more memory than needed.
    td_ = BandMatrix<double>(t1_size, k);
    // Fill in for initially marking all subtree pairs as not eligable, and for debugging.
    // td_.fill_with(std::numeric_limits<double>::signaling_NaN());
    td_.Matrix::fill_with(std::numeric_limits<double>::infinity());
    // NOTE: The band_width=e for Touzet's fd_ matrix varies. It is however
    //       smaller or equal to the initialised band_width=k+1. As long as we
    //       read and write using the original band_width, addresses are not
    //       messed up. We only have to ensure that we do not iterate over too
    //       many elements using k instead of e.
    fd_ = BandMatrix<double>(t1_size + 1, k + 1);
    fd_.Matrix::fill_with(std::numeric_limits<double>::infinity());
  }